

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t intersection_uint32(uint32_t *A,size_t lenA,uint32_t *B,size_t lenB,uint32_t *out)

{
  uint32_t *puVar1;
  uint32_t *endB;
  uint32_t *endA;
  uint32_t *initout;
  uint32_t *out_local;
  size_t lenB_local;
  uint32_t *B_local;
  size_t lenA_local;
  uint32_t *A_local;
  
  if ((lenA == 0) || (lenB == 0)) {
    return 0;
  }
  lenB_local = (size_t)B;
  lenA_local = (size_t)A;
  initout = out;
  do {
    while (*(uint *)lenA_local < *(uint *)lenB_local) {
LAB_001035f3:
      lenA_local = lenA_local + 4;
      if ((uint32_t *)lenA_local == A + lenA) {
        return (long)initout - (long)out >> 2;
      }
    }
    while (*(uint *)lenB_local < *(uint *)lenA_local) {
      lenB_local = lenB_local + 4;
      if ((uint32_t *)lenB_local == B + lenB) {
        return (long)initout - (long)out >> 2;
      }
    }
    if (*(int *)lenA_local != *(int *)lenB_local) goto LAB_001035f3;
    puVar1 = initout + 1;
    *initout = *(uint32_t *)lenA_local;
    lenA_local = lenA_local + 4;
    if (((uint32_t *)lenA_local == A + lenA) ||
       (lenB_local = lenB_local + 4, initout = puVar1, (uint32_t *)lenB_local == B + lenB)) {
      return (long)puVar1 - (long)out >> 2;
    }
  } while( true );
}

Assistant:

size_t intersection_uint32(const uint32_t *A, const size_t lenA,
                           const uint32_t *B, const size_t lenB,
                           uint32_t *out) {
    const uint32_t *initout = out;
    if (lenA == 0 || lenB == 0) return 0;
    const uint32_t *endA = A + lenA;
    const uint32_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return (out - initout);
        }
        while (*A > *B) {
            if (++B == endB) return (out - initout);
        }
        if (*A == *B) {
            *out++ = *A;
            if (++A == endA || ++B == endB) return (out - initout);
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    return (out - initout);  // NOTREACHED
}